

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

bitset_t * bitset_create_with_capacity(size_t size)

{
  bitset_t *__ptr;
  uint64_t *puVar1;
  ulong __nmemb;
  
  __ptr = (bitset_t *)roaring_malloc(0x18);
  if (__ptr != (bitset_t *)0x0) {
    __nmemb = size + 0x3f >> 6;
    __ptr->arraysize = __nmemb;
    __ptr->capacity = __nmemb;
    puVar1 = (uint64_t *)roaring_calloc(__nmemb,8);
    __ptr->array = puVar1;
    if (puVar1 != (uint64_t *)0x0) {
      return __ptr;
    }
    roaring_free(__ptr);
  }
  return (bitset_t *)0x0;
}

Assistant:

bitset_t *bitset_create_with_capacity(size_t size) {
    bitset_t *bitset = NULL;
    /* Allocate the bitset itself. */
    if ((bitset = (bitset_t *)roaring_malloc(sizeof(bitset_t))) == NULL) {
        return NULL;
    }
    bitset->arraysize =
        (size + sizeof(uint64_t) * 8 - 1) / (sizeof(uint64_t) * 8);
    bitset->capacity = bitset->arraysize;
    if ((bitset->array = (uint64_t *)roaring_calloc(
             bitset->arraysize, sizeof(uint64_t))) == NULL) {
        roaring_free(bitset);
        return NULL;
    }
    return bitset;
}